

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogManager.cpp
# Opt level: O2

void __thiscall helics::LogManager::initializeLogging(LogManager *this,string *identifier)

{
  shared_ptr<spdlog::logger> *this_00;
  logger *this_01;
  bool bVar1;
  allocator<char> local_ba;
  bool expected;
  undefined1 local_b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  expected = false;
  bVar1 = CLI::std::atomic<bool>::compare_exchange_strong(&this->initialized,&expected,true,seq_cst)
  ;
  if (bVar1) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&this->logIdentifier,identifier);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_b8 + 0x10),"console",&local_ba);
    spdlog::get((string *)local_b8);
    this_00 = &this->consoleLogger;
    CLI::std::__shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&this_00->super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2> *)local_b8);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 8));
    std::__cxx11::string::~string((string *)(local_b8 + 0x10));
    if ((this->consoleLogger).super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        == (element_type *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_b8 + 0x10),"console",&local_ba);
      spdlog::stdout_color_mt<spdlog::synchronous_factory>((string *)local_b8,(int)local_b8 + 0x10);
      CLI::std::__shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&this_00->super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2> *)local_b8);
      CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 8));
      std::__cxx11::string::~string((string *)(local_b8 + 0x10));
      spdlog::logger::flush_on
                ((this_00->super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                 info);
      spdlog::logger::set_level
                ((this_00->super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                 trace);
    }
    bVar1 = std::operator==(&this->logFile,"syslog");
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_b8 + 0x10),"syslog",&local_ba);
      spdlog::syslog_logger_mt<spdlog::synchronous_factory>
                ((string *)local_b8,(string *)(local_b8 + 0x10),(int)identifier,0,true);
      CLI::std::__shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->fileLogger).super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2> *)local_b8);
      CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 8));
      std::__cxx11::string::~string((string *)(local_b8 + 0x10));
    }
    else if ((this->logFile)._M_string_length != 0) {
      local_38 = 0;
      uStack_30 = 0;
      local_48 = 0;
      uStack_40 = 0;
      local_58 = 0;
      uStack_50 = 0;
      local_68 = 0;
      uStack_60 = 0;
      local_78 = 0;
      uStack_70 = 0;
      local_88 = 0;
      uStack_80 = 0;
      local_98 = 0;
      uStack_90 = 0;
      local_a8._M_allocated_capacity = 0;
      local_a8._8_8_ = 0;
      spdlog::basic_logger_mt<spdlog::synchronous_factory>
                ((string *)local_b8,identifier,SUB81(&this->logFile,0),(file_event_handlers *)0x0);
      CLI::std::__shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->fileLogger).super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2> *)local_b8);
      CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 8));
      spdlog::file_event_handlers::~file_event_handlers((file_event_handlers *)(local_b8 + 0x10));
    }
    this_01 = (this->fileLogger).super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    if (this_01 != (logger *)0x0) {
      spdlog::logger::flush_on(this_01,info);
      spdlog::logger::set_level
                ((this->fileLogger).super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,trace);
    }
  }
  return;
}

Assistant:

void LogManager::initializeLogging(const std::string& identifier)
{
    bool expected{false};
    if (initialized.compare_exchange_strong(expected, true)) {
        logIdentifier = identifier;
        try {
            consoleLogger = spdlog::get("console");
            if (!consoleLogger) {
                try {
                    consoleLogger = spdlog::stdout_color_mt("console");
                    consoleLogger->flush_on(spdlog::level::info);
                    consoleLogger->set_level(spdlog::level::trace);
                }
                catch (const spdlog::spdlog_ex&) {
                    consoleLogger = spdlog::get("console");
                }
            }
            if (logFile == "syslog") {
#if !defined(WIN32) && !defined(__MINGW32__) && !defined(CYGWIN) && !defined(_WIN32)
                fileLogger = spdlog::syslog_logger_mt("syslog", identifier);
#endif
            } else if (!logFile.empty()) {
                fileLogger = spdlog::basic_logger_mt(identifier, logFile);
            }
            if (fileLogger) {
                fileLogger->flush_on(spdlog::level::info);
                fileLogger->set_level(spdlog::level::trace);
            }
        }
        catch (const spdlog::spdlog_ex& ex) {
            std::cerr << "Log init failed in " << identifier << " : " << ex.what() << std::endl;
        }
    }
}